

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::request_time_critical_pieces(torrent *this)

{
  undefined1 auVar1 [16];
  piece_index_t piece;
  value_type *pppVar2;
  pointer ptVar3;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  peer_connection *this_01;
  pointer pppVar4;
  pointer pppVar5;
  pointer ppVar6;
  pointer ppVar7;
  bool bVar8;
  int iVar9;
  int timed_out;
  int iVar10;
  ulong uVar11;
  long lVar12;
  time_point tVar13;
  time_duration tVar14;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  __x;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *pieces;
  undefined4 extraout_var;
  vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_> *pvVar15;
  __normal_iterator<const_libtorrent::aux::pending_block_*,_std::vector<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>_>
  _Var16;
  time_duration tVar17;
  _Base_ptr p_Var18;
  pointer ptVar19;
  value_type *__x_00;
  peer_connection **__src;
  uint uVar20;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  __i;
  long lVar21;
  long lVar22;
  pointer pppVar23;
  undefined1 auVar24 [16];
  vector<peer_connection_*> peers;
  downloading_piece pi;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> interesting_blocks;
  piece_block b;
  peer_connection *local_100;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ignore_peers;
  vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> backup;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ignore;
  set<libtorrent::aux::peer_connection_*,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  peers_with_requests;
  _Bind<bool_(libtorrent::aux::peer_connection::*(std::_Placeholder<1>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>))(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)_const>
  local_48;
  
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peers.
  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  .
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = num_peers(this);
  container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
  ::reserve<int,void>((container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                       *)&peers,iVar9);
  pppVar2 = (this->super_torrent_hot_members).m_connections.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__x_00 = (this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start; __x_00 != pppVar2; __x_00 = __x_00 + 1) {
    bVar8 = peer_connection::can_request_time_critical(*__x_00);
    if (bVar8) {
      ::std::
      vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::push_back(&peers.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ,__x_00);
    }
  }
  pppVar4 = peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pppVar5 = peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (peers.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      peers.
      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      .
      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar21 = (long)peers.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)peers.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = lVar21 >> 3;
    lVar12 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
              (peers.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               peers.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar21 < 0x81) {
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
                (pppVar4,pppVar5);
    }
    else {
      pppVar23 = pppVar4 + 0x10;
      ::std::
      __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
                (pppVar4,pppVar23);
      for (; pppVar23 != pppVar5; pppVar23 = pppVar23 + 1) {
        ::std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__1>>
                  (pppVar23);
      }
    }
  }
  container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
  ::resize<int,void>((container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                      *)&peers,
                     ((int)((ulong)((long)peers.
                                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                          .
                                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)peers.
                                         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                         .
                                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * 9 + 9) /
                     10);
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ignore_peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ignore_peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ignore_peers.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar12 = ::std::chrono::_V2::system_clock::now();
  ptVar19 = (this->m_time_critical_pieces).
            super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ptVar3 = (this->m_time_critical_pieces).
           super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = true;
  while (((ptVar19 != ptVar3 &&
          (peers.
           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           .
           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           peers.
           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           .
           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         ((bVar8 || ((ptVar19->deadline).__d.__r <=
                     (long)(this->m_average_piece_time + this->m_piece_time_deviation * 4 + 1000) *
                     1000000 + lVar12))))) {
    pi.index.m_val = 0x7fffffff;
    pi.info_idx = 0xffff;
    pi._6_4_ = 0;
    pi._10_2_ = 0;
    piece_picker::piece_info
              ((this->super_torrent_hot_members).m_picker._M_t.
               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
               (piece_index_t)(ptVar19->piece).m_val,&pi);
    iVar9 = piece_picker::blocks_in_piece
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       (piece_index_t)(ptVar19->piece).m_val);
    timed_out = 0;
    if (iVar9 == ((ushort)pi._10_2_ & 0x7fff) + (pi._6_4_ & 0x7fff) +
                 ((uint)pi._6_4_ >> 0x10 & 0x7fff)) {
      lVar21 = (ptVar19->last_requested).__d.__r;
      if (lVar21 == -0x8000000000000000) {
        (ptVar19->last_requested).__d.__r = lVar12;
        lVar21 = lVar12;
      }
      if (this->m_average_piece_time < 1) {
        timed_out = 0;
      }
      else {
        uVar20 = this->m_piece_time_deviation / 2 + this->m_average_piece_time;
        uVar11 = (ulong)uVar20;
        if ((int)uVar20 < 2) {
          uVar11 = 1;
        }
        timed_out = (int)(((lVar12 - lVar21) / 1000000) / (long)uVar11);
      }
      if ((timed_out != 0) && ((pi._10_2_ & 0x7fff) != 0)) goto LAB_002e5c03;
    }
    else {
LAB_002e5c03:
      this_00._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      interesting_blocks.
      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interesting_blocks.
      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      interesting_blocks.
      super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      backup.super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      backup.super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      backup.super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ignore.
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ignore.
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ignore.
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tVar13 = time_now();
      do {
        if (peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          tVar14 = peer_connection::download_queue_time
                             (*peers.
                               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               .
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,0);
          if (2000000000 < tVar14.__r) break;
        }
        local_48._M_f = (offset_in_peer_connection_to_subr)peer_connection::has_piece;
        local_48._8_8_ = 0;
        local_48._M_bound_args.
        super__Tuple_impl<0UL,_std::_Placeholder<1>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
        .
        super__Tuple_impl<1UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
        .
        super__Head_base<1UL,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_false>
        ._M_head_impl.m_val =
             (_Tuple_impl<0UL,_std::_Placeholder<1>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
              )(ptVar19->piece).m_val;
        __x = ::std::
              find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,std::_Bind<bool(libtorrent::aux::peer_connection::*(std::_Placeholder<1>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>))(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)const>>
                        ((__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                          )peers.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                          )peers.
                           super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           .
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_48);
        if (__x._M_current ==
            peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) break;
        this_01 = *__x._M_current;
        if (interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          interesting_blocks.
          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               interesting_blocks.
               super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        if (backup.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            backup.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          backup.
          super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               backup.
               super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        piece.m_val = (ptVar19->piece).m_val;
        pieces = peer_connection::get_bitfield(this_01);
        iVar10 = (*(this_01->super_bandwidth_socket)._vptr_bandwidth_socket[7])(this_01);
        piece_picker::add_blocks
                  (this_00._M_head_impl,piece,pieces,&interesting_blocks,&backup,iVar9,0,
                   (torrent_peer *)CONCAT44(extraout_var,iVar10),&ignore,(picker_options_t)0x0);
        ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
        insert<__gnu_cxx::__normal_iterator<libtorrent::piece_block*,std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>>,void>
                  ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
                   &interesting_blocks,
                   (const_iterator)
                   interesting_blocks.
                   super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<libtorrent::piece_block_*,_std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>_>
                    )backup.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<libtorrent::piece_block_*,_std::vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>_>
                    )backup.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        ppVar6 = interesting_blocks.
                 super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar7 = interesting_blocks.
                 super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          if (timed_out == 0) break;
          anon_unknown_135::pick_busy_blocks
                    (this_00._M_head_impl,(piece_index_t)(ptVar19->piece).m_val,iVar9,timed_out,
                     &interesting_blocks,&pi);
        }
        if (interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            interesting_blocks.
            super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
            _M_impl.super__Vector_impl_data._M_finish) break;
        b = *interesting_blocks.
             super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pvVar15 = peer_connection::download_queue(this_01);
        _Var16 = ::std::
                 __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::pending_block_const*,std::vector<libtorrent::aux::pending_block,std::allocator<libtorrent::aux::pending_block>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::has_block>>
                           ((pvVar15->
                            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                            (pvVar15->
                            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                            )._M_impl.super__Vector_impl_data._M_finish,&b);
        if (_Var16._M_current ==
            (pvVar15->
            super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          pvVar15 = peer_connection::request_queue(this_01);
          _Var16 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::pending_block_const*,std::vector<libtorrent::aux::pending_block,std::allocator<libtorrent::aux::pending_block>>>,__gnu_cxx::__ops::_Iter_pred<libtorrent::aux::has_block>>
                             ((pvVar15->
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                              (pvVar15->
                              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
                              )._M_impl.super__Vector_impl_data._M_finish,&b);
          if (_Var16._M_current ==
              (pvVar15->
              super__Vector_base<libtorrent::aux::pending_block,_std::allocator<libtorrent::aux::pending_block>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            bVar8 = peer_connection::add_request
                              (this_01,&b,(request_flags_t)((ppVar6 == ppVar7) * '\x02' + '\x01'));
            if (!bVar8) goto LAB_002e5f30;
            local_100 = this_01;
            ::std::
            _Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
            ::_M_insert_unique_<libtorrent::aux::peer_connection*>
                      ((_Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
                        *)&peers_with_requests,
                       (const_iterator)
                       peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       &local_100);
          }
          else {
            bVar8 = peer_connection::make_time_critical(this_01,&b);
            if (!bVar8) {
LAB_002e5f30:
              ::std::
              vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ::push_back(&ignore_peers,__x._M_current);
              goto LAB_002e5f40;
            }
            (ptVar19->last_requested).__d.__r = (rep)tVar13.__d.__r;
            local_100 = this_01;
            ::std::
            _Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
            ::_M_insert_unique_<libtorrent::aux::peer_connection*>
                      ((_Rb_tree<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*,std::_Identity<libtorrent::aux::peer_connection*>,std::less<libtorrent::aux::peer_connection*>,std::allocator<libtorrent::aux::peer_connection*>>
                        *)&peers_with_requests,
                       (const_iterator)
                       peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       &local_100);
          }
          if (ppVar6 != ppVar7) {
            (ptVar19->last_requested).__d.__r = (rep)tVar13.__d.__r;
          }
          if ((ptVar19->first_requested).__d.__r == -0x8000000000000000) {
            (ptVar19->first_requested).__d.__r = (rep)tVar13.__d.__r;
          }
          bVar8 = peer_connection::can_request_time_critical(this_01);
          if (!bVar8) goto LAB_002e5f40;
          for (; (undefined1 (*) [16])__x._M_current !=
                 (undefined1 (*) [16])
                 (peers.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1);
              __x._M_current = (peer_connection **)(*(undefined1 (*) [16])__x._M_current + 8)) {
            tVar14 = peer_connection::download_queue_time
                               (*(peer_connection **)*(undefined1 (*) [16])__x._M_current,0);
            tVar17 = peer_connection::download_queue_time
                               (*(peer_connection **)(*(undefined1 (*) [16])__x._M_current + 8),0);
            if (tVar14.__r <= tVar17.__r) break;
            auVar1 = *(undefined1 (*) [16])__x._M_current;
            auVar24._0_8_ = auVar1._8_8_;
            auVar24._8_4_ = auVar1._0_4_;
            auVar24._12_4_ = auVar1._4_4_;
            *(undefined1 (*) [16])__x._M_current = auVar24;
          }
        }
        else {
          ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::push_back(&ignore_peers,__x._M_current);
LAB_002e5f40:
          __src = __x._M_current + 1;
          if (__src != peers.
                       super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       .
                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
            memmove(__x._M_current,__src,
                    (long)peers.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
          }
          peers.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          .
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               peers.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
        }
      } while (interesting_blocks.
               super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               interesting_blocks.
               super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      ::std::
      _Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ::~_Vector_base(&ignore.
                       super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     );
      ::std::_Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::
      ~_Vector_base(&backup.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                   );
      ::std::_Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>::
      ~_Vector_base(&interesting_blocks.
                     super__Vector_base<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                   );
      if (ignore_peers.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          ignore_peers.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::
        vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
        ::
        insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,void>
                  ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                    *)&peers,
                   (const_iterator)
                   peers.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    )ignore_peers.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                    )ignore_peers.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        if (ignore_peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            ignore_peers.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          ignore_peers.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               ignore_peers.
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        pppVar4 = peers.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pppVar5 = peers.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            peers.
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar22 = (long)peers.
                         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         .
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)peers.
                         super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         .
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = lVar22 >> 3;
          lVar21 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          ::std::
          __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                    (peers.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     peers.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar22 < 0x81) {
            ::std::
            __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                      (pppVar4);
          }
          else {
            pppVar23 = pppVar4 + 0x10;
            ::std::
            __insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                      (pppVar4);
            for (; pppVar23 != pppVar5; pppVar23 = pppVar23 + 1) {
              ::std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<libtorrent::aux::peer_connection**,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,__gnu_cxx::__ops::_Val_comp_iter<libtorrent::aux::torrent::request_time_critical_pieces()::__2>>
                        (pppVar23);
            }
          }
        }
      }
      if (peers.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          .
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          peers.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          .
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        tVar14 = peer_connection::download_queue_time
                           (*peers.
                             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             .
                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,0);
        if (2000000000 < tVar14.__r) break;
      }
    }
    ptVar19 = ptVar19 + 1;
    bVar8 = false;
  }
  for (p_Var18 = peers_with_requests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var18 != &peers_with_requests._M_t._M_impl.super__Rb_tree_header;
      p_Var18 = (_Base_ptr)::std::_Rb_tree_increment(p_Var18)) {
    peer_connection::send_block_requests(*(peer_connection **)(p_Var18 + 1));
  }
  ::std::
  _Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ::~_Vector_base(&ignore_peers.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 );
  ::std::
  _Rb_tree<libtorrent::aux::peer_connection_*,_libtorrent::aux::peer_connection_*,_std::_Identity<libtorrent::aux::peer_connection_*>,_std::less<libtorrent::aux::peer_connection_*>,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ::~_Rb_tree(&peers_with_requests._M_t);
  ::std::
  _Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ::~_Vector_base((_Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   *)&peers);
  return;
}

Assistant:

void torrent::request_time_critical_pieces()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(!upload_mode());

		// build a list of peers and sort it by download_queue_time
		// we use this sorted list to determine which peer we should
		// request a block from. The earlier a peer is in the list,
		// the sooner we will fully download the block we request.
		aux::vector<peer_connection*> peers;
		peers.reserve(num_peers());

		// some peers are marked as not being able to request time critical
		// blocks from. For instance, peers that have choked us, peers that are
		// on parole (i.e. they are believed to have sent us bad data), peers
		// that are being disconnected, in upload mode etc.
		std::remove_copy_if(m_connections.begin(), m_connections.end()
			, std::back_inserter(peers), [] (peer_connection* p)
			{ return !p->can_request_time_critical(); });

		// sort by the time we believe it will take this peer to send us all
		// blocks we've requested from it. The shorter time, the better candidate
		// it is to request a time critical block from.
		std::sort(peers.begin(), peers.end()
			, [] (peer_connection const* lhs, peer_connection const* rhs)
			{ return lhs->download_queue_time(16*1024) < rhs->download_queue_time(16*1024); });

		// remove the bottom 10% of peers from the candidate set.
		// this is just to remove outliers that might stall downloads
		int const new_size = (peers.end_index() * 9 + 9) / 10;
		TORRENT_ASSERT(new_size <= peers.end_index());
		peers.resize(new_size);

		// remember all the peers we issued requests to, so we can commit them
		// at the end of this function. Instead of sending the requests right
		// away, we batch them up and send them in a single write to the TCP
		// socket, increasing the chance that they will all be sent in the same
		// packet.
		std::set<peer_connection*> peers_with_requests;

		// peers that should be temporarily ignored for a specific piece
		// in order to give priority to other peers. They should be used for
		// subsequent pieces, so they are stored in this vector until the
		// piece is done
		std::vector<peer_connection*> ignore_peers;

		time_point const now = clock_type::now();

		// now, iterate over all time critical pieces, in order of importance, and
		// request them from the peers, in order of responsiveness. i.e. request
		// the most time critical pieces from the fastest peers.
		bool first_piece{true};
		for (auto& i : m_time_critical_pieces)
		{
#if TORRENT_DEBUG_STREAMING > 1
			std::printf("considering %d\n", i->piece);
#endif

			if (peers.empty())
			{
#if TORRENT_DEBUG_STREAMING > 1
				std::printf("out of peers, done\n");
#endif
				break;
			}

			// the +1000 is to compensate for the fact that we only call this
			// function once per second, so if we need to request it 500 ms from
			// now, we should request it right away
			if (!first_piece && i.deadline > now
				+ milliseconds(m_average_piece_time + m_piece_time_deviation * 4 + 1000))
			{
				// don't request pieces whose deadline is too far in the future
				// this is one of the termination conditions. We don't want to
				// send requests for all pieces in the torrent right away
#if TORRENT_DEBUG_STREAMING > 0
				std::printf("reached deadline horizon [%f + %f * 4 + 1]\n"
					, m_average_piece_time / 1000.f
					, m_piece_time_deviation / 1000.f);
#endif
				break;
			}
			first_piece = false;

			piece_picker::downloading_piece pi;
			m_picker->piece_info(i.piece, pi);

			// the number of "times" this piece has timed out.
			int timed_out = 0;

			int const blocks_in_piece = m_picker->blocks_in_piece(i.piece);

#if TORRENT_DEBUG_STREAMING > 0
			i.timed_out = timed_out;
#endif
			int const free_to_request = blocks_in_piece
				- pi.finished - pi.writing - pi.requested;

			if (free_to_request == 0)
			{
				if (i.last_requested == min_time())
					i.last_requested = now;

				// if it's been more than half of the typical download time
				// of a piece since we requested the last block, allow
				// one more request per block
				if (m_average_piece_time > 0)
					timed_out = int(total_milliseconds(now - i.last_requested)
						/ std::max(int(m_average_piece_time + m_piece_time_deviation / 2), 1));

#if TORRENT_DEBUG_STREAMING > 0
				i.timed_out = timed_out;
#endif
				// every block in this piece is already requested
				// there's no need to consider this piece, unless it
				// appears to be stalled.
				if (pi.requested == 0 || timed_out == 0)
				{
#if TORRENT_DEBUG_STREAMING > 1
					std::printf("skipping %d (full) [req: %d timed_out: %d ]\n"
						, i.piece, pi.requested
						, timed_out);
#endif

					// if requested is 0, it means all blocks have been received, and
					// we're just waiting for it to flush them to disk.
					// if last_requested is recent enough, we should give it some
					// more time
					// skip to the next piece
					continue;
				}

				// it's been too long since we requested the last block from
				// this piece. Allow re-requesting blocks from this piece
#if TORRENT_DEBUG_STREAMING > 1
				std::printf("timed out [average-piece-time: %d ms ]\n"
					, m_average_piece_time);
#endif
			}

			// pick all blocks for this piece. the peers list is kept up to date
			// and sorted. when we issue a request to a peer, its download queue
			// time will increase and it may need to be bumped in the peers list,
			// since it's ordered by download queue time
			pick_time_critical_block(peers, ignore_peers
				, peers_with_requests
				, pi, &i, m_picker.get()
				, blocks_in_piece, timed_out);

			// put back the peers we ignored into the peer list for the next piece
			if (!ignore_peers.empty())
			{
				peers.insert(peers.begin(), ignore_peers.begin(), ignore_peers.end());
				ignore_peers.clear();

				// TODO: instead of resorting the whole list, insert the peers
				// directly into the right place
				std::sort(peers.begin(), peers.end()
					, [] (peer_connection const* lhs, peer_connection const* rhs)
					{ return lhs->download_queue_time(16*1024) < rhs->download_queue_time(16*1024); });
			}

			// if this peer's download time exceeds 2 seconds, we're done.
			// We don't want to build unreasonably long request queues
			if (!peers.empty() && peers[0]->download_queue_time() > milliseconds(2000))
				break;
		}

		// commit all the time critical requests
		for (auto* p : peers_with_requests)
		{
			p->send_block_requests();
		}
	}